

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRpo.c
# Opt level: O2

void Abc_TruthRpoTest(char *pFileName,int nVarNum,int nThreshold,int fVerbose)

{
  uint uVar1;
  word *pwVar2;
  Rpo_TtStore_t *p;
  word **ppwVar3;
  long lVar4;
  char *pcVar5;
  byte bVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  char *pcVar11;
  uint uVar12;
  byte bVar13;
  int iVar14;
  int nTruths;
  int nVars;
  
  if (nVarNum < 0) {
    Abc_TruthGetParams(pFileName,&nVars,&nTruths);
    if (nVars - 2U < 0xf && nTruths != 0) {
      lVar7 = (long)nTruths;
      p = (Rpo_TtStore_t *)malloc(0x18);
      bVar6 = (char)nVars - 6;
      uVar10 = (ulong)(uint)(1 << (bVar6 & 0x1f));
      if ((uint)nVars < 7) {
        uVar10 = 1;
      }
      p->nVars = nVars;
      p->nWords = (int)uVar10;
      p->nFuncs = nTruths;
      bVar13 = bVar6;
      if ((uint)nVars < 7) {
        bVar13 = 0;
      }
      ppwVar3 = (word **)malloc((uVar10 * 8 + 8) * lVar7);
      p->pFuncs = ppwVar3;
      *ppwVar3 = (word *)(ppwVar3 + lVar7);
      memset(ppwVar3 + lVar7,0,lVar7 << (bVar13 + 3 & 0x3f));
      for (lVar4 = 1; lVar4 < lVar7; lVar4 = lVar4 + 1) {
        ppwVar3[lVar4] = ppwVar3[lVar4 + -1] + uVar10;
      }
      pcVar5 = Abc_FileRead(pFileName);
      if (pcVar5 != (char *)0x0) {
        uVar1 = 0x10 << (bVar6 & 0x1f);
        if ((uint)nVars < 7) {
          uVar1 = 0x10;
        }
        lVar7 = 0;
        uVar10 = 0;
        if (0 < (int)uVar1) {
          uVar10 = (ulong)uVar1;
        }
        lVar4 = 0;
        while( true ) {
          lVar4 = (long)(int)lVar4;
          if (pcVar5[lVar4] == '\n') break;
          pcVar11 = pcVar5 + lVar4;
          if (pcVar5[lVar4] == '0') {
            pcVar11 = pcVar11 + (ulong)(pcVar11[1] == 'x') * 2;
          }
          if ((0x20 < (ulong)(byte)pcVar11[(int)uVar1]) ||
             ((0x100002401U >> ((ulong)(byte)pcVar11[(int)uVar1] & 0x3f) & 1) == 0)) {
            pcVar11 = 
            "EndSymbol == \' \' || EndSymbol == \'\\n\' || EndSymbol == \'\\r\' || EndSymbol == \'\\0\'"
            ;
            pcVar5 = "void Abc_TruthReadHex(word *, char *, int)";
            uVar1 = 0x6d;
LAB_0026d969:
            __assert_fail(pcVar11,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRpo.c"
                          ,uVar1,pcVar5);
          }
          pwVar2 = ppwVar3[lVar7];
          lVar7 = lVar7 + 1;
          for (uVar8 = 0; uVar8 != uVar10; uVar8 = uVar8 + 1) {
            bVar6 = pcVar11[(int)(~(uint)uVar8 + uVar1)];
            iVar14 = -0x30;
            if (((9 < (byte)(bVar6 - 0x30)) && (iVar14 = -0x37, 5 < (byte)(bVar6 + 0xbf))) &&
               (iVar14 = -0x57, 5 < (byte)(bVar6 + 0x9f))) {
              pcVar11 = "0";
              pcVar5 = "int Abc_TruthReadHexDigit(char)";
              uVar1 = 0x51;
              goto LAB_0026d969;
            }
            pwVar2[uVar8 >> 4 & 0xfffffff] =
                 pwVar2[uVar8 >> 4 & 0xfffffff] |
                 (ulong)(iVar14 + (uint)bVar6) << ((char)uVar8 * '\x04' & 0x3fU);
          }
          do {
            pcVar11 = pcVar5 + lVar4;
            lVar4 = lVar4 + 1;
          } while (*pcVar11 != '\n');
        }
        if (nTruths < (int)lVar7) {
          __assert_fail("p->nFuncs >= nLines",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRpo.c"
                        ,0x101,"void Abc_TruthStoreRead(char *, Rpo_TtStore_t *)");
        }
        p->nFuncs = (int)lVar7;
        free(pcVar5);
      }
      goto LAB_0026d8ee;
    }
  }
  else {
    uVar1 = Abc_FileSize(pFileName);
    uVar12 = 1 << ((char)nVarNum - 3U & 0x1f);
    iVar14 = (int)uVar1 / (int)uVar12;
    if (uVar1 != 0xffffffff) {
      if ((uint)nVarNum < 6) {
        __assert_fail("nVarNum >= 6",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRpo.c"
                      ,0x141,"Rpo_TtStore_t *Abc_TtStoreLoad(char *, int)");
      }
      if ((int)((long)(int)uVar1 % (long)(int)uVar12) != 0) {
        Abc_Print(0,
                  "The file size (%d) is divided by the truth table size (%d) with remainder (%d).\n"
                  ,(ulong)uVar1,(ulong)uVar12,(long)(int)uVar1 % (long)(int)uVar12 & 0xffffffff);
      }
      pwVar2 = (word *)Abc_FileRead(pFileName);
      p = (Rpo_TtStore_t *)malloc(0x18);
      p->nVars = nVarNum;
      iVar9 = 1 << ((char)nVarNum - 6U & 0x1f);
      p->nWords = iVar9;
      p->nFuncs = iVar14;
      ppwVar3 = (word **)malloc((long)iVar14 * 8);
      p->pFuncs = ppwVar3;
      *ppwVar3 = pwVar2;
      for (lVar7 = 1; lVar7 < iVar14; lVar7 = lVar7 + 1) {
        ppwVar3[lVar7] = ppwVar3[lVar7 + -1] + iVar9;
      }
      goto LAB_0026d8ee;
    }
  }
  p = (Rpo_TtStore_t *)0x0;
LAB_0026d8ee:
  if (fVerbose != 0) {
    Abc_Print(-2,"Number of variables = %d\n",(ulong)(uint)p->nVars);
  }
  Abc_TruthRpoPerform(p,nThreshold,fVerbose);
  ppwVar3 = p->pFuncs;
  if ((-1 < nVarNum) && (*ppwVar3 != (word *)0x0)) {
    free(*ppwVar3);
    ppwVar3 = p->pFuncs;
    *ppwVar3 = (word *)0x0;
  }
  free(ppwVar3);
  free(p);
  return;
}

Assistant:

void Abc_TruthRpoTest(char * pFileName, int nVarNum, int nThreshold, int fVerbose) {
    Rpo_TtStore_t * p;

    // allocate data-structure
//    if (fVerbose) {
//        Abc_Print(-2, "Number of variables = %d\n", nVarNum);
//    }
    p = Abc_TtStoreLoad(pFileName, nVarNum);

    if (fVerbose) {
        Abc_Print(-2, "Number of variables = %d\n", p->nVars);
    }
    // consider functions from the file
    Abc_TruthRpoPerform(p, nThreshold, fVerbose);

    // delete data-structure
    Abc_TtStoreFree(p, nVarNum);
    //    printf( "Finished decomposing truth tables from file \"%s\".\n", pFileName );
}